

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

uint * gf_polydiv_recursive(uint *a,uint alen,uint *b,uint blen,uint *new_len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  uint *__dest;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong __nmemb;
  ulong __nmemb_00;
  
  iVar8 = blen - alen;
  __nmemb_00 = (ulong)alen;
  while (uVar9 = (uint)__nmemb_00, blen <= uVar9) {
    uVar4 = uVar9 - 1;
    __nmemb = (ulong)uVar4;
    if ((ulong)a[__nmemb] == 0) {
      uVar10 = 0;
    }
    else if ((ulong)b[blen - 1] == 0) {
      uVar10 = 0xffffffff;
    }
    else {
      iVar3 = index_of[a[__nmemb]] - index_of[b[blen - 1]];
      iVar2 = iVar3 + 0xff;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      uVar10 = alpha_of[iVar2];
    }
    __ptr = calloc(__nmemb_00,4);
    if (__nmemb_00 != 0) {
      uVar5 = 0;
      do {
        uVar7 = 0;
        if (uVar9 - blen <= uVar5) {
          uVar7 = b[(uint)(iVar8 + (int)uVar5)];
        }
        *(uint *)((long)__ptr + uVar5 * 4) = uVar7;
        uVar5 = uVar5 + 1;
      } while (__nmemb_00 != uVar5);
      sVar6 = 0;
      do {
        uVar7 = 0;
        if ((uVar10 != 0) && (uVar1 = *(uint *)((long)__ptr + sVar6 * 4), uVar1 != 0)) {
          uVar7 = index_of[uVar10] + index_of[uVar1];
          uVar1 = (index_of[uVar10] - 0xff) + index_of[uVar1];
          if (uVar7 < 0xff) {
            uVar1 = uVar7;
          }
          uVar7 = alpha_of[uVar1];
        }
        *(uint *)((long)__ptr + sVar6 * 4) = uVar7;
        a[sVar6] = a[sVar6] ^ uVar7;
        sVar6 = sVar6 + 1;
      } while (__nmemb_00 != sVar6);
    }
    __dest = (uint *)calloc(__nmemb,4);
    if (uVar4 != 0) {
      memcpy(__dest,a,(ulong)(uVar9 - 2) * 4 + 4);
    }
    free(a);
    free(__ptr);
    if (new_len != (uint *)0x0) {
      *new_len = uVar4;
    }
    iVar8 = iVar8 + 1;
    a = __dest;
    __nmemb_00 = __nmemb;
  }
  return a;
}

Assistant:

uint32_t *gf_polydiv_recursive(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *new_len)
{
    if (alen < blen)
        return a;

    uint32_t q = gf_div(a[alen - 1], b[blen - 1]);

    // g = [0,0...0, b[0], b[1], b[n]]
    // alen-blen zeros at the start
    uint32_t *g = vector_new(alen);
    for (uint32_t i = 0; i < alen; i++)
        g[i] = (i < alen - blen) ? 0 : b[i - (alen - blen)];

    for (uint32_t i = 0; i < alen; i++)
    {
        g[i] = gf_mul(g[i], q);
        a[i] = gf_sum(a[i], g[i]);
    }

    uint32_t a_new_len = alen - 1;
    uint32_t *a_new = submatrix(a, 0, a_new_len);

    vector_free(a);
    vector_free(g);

    if (new_len != NULL)
        *new_len = a_new_len;

    return gf_polydiv_recursive(a_new, a_new_len, b, blen, new_len);
}